

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

long64 __thiscall ClipperLib::Clipper::PopScanbeam(Clipper *this)

{
  Scanbeam *pSVar1;
  long64 lVar2;
  
  pSVar1 = this->m_Scanbeam;
  lVar2 = pSVar1->Y;
  this->m_Scanbeam = pSVar1->next;
  operator_delete(pSVar1,0x10);
  return lVar2;
}

Assistant:

long64 Clipper::PopScanbeam()
{
  long64 Y = m_Scanbeam->Y;
  Scanbeam* sb2 = m_Scanbeam;
  m_Scanbeam = m_Scanbeam->next;
  delete sb2;
  return Y;
}